

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O0

void duckdb::SortedAggregateFunction::ProjectInputs
               (Vector *inputs,SortedAggregateBindData *order_bind,idx_t input_count,idx_t count,
               DataChunk *arg_input,DataChunk *sort_input)

{
  bool bVar1;
  iterator __lhs;
  Vector *in_RCX;
  long in_RSI;
  Vector *in_R8;
  DataChunk *in_R9;
  Vector *dst_1;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::Vector,_true> *__range2;
  Vector *dst;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::Vector,_true> *__range3;
  idx_t col;
  reference in_stack_ffffffffffffff88;
  __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
  local_68;
  DataChunk *local_60;
  reference in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
  local_48 [2];
  long local_38;
  DataChunk *local_30;
  
  local_38 = 0;
  local_30 = in_R9;
  if ((*(byte *)(in_RSI + 0x1c0) & 1) == 0) {
    DataChunk::InitializeEmpty
              ((DataChunk *)in_stack_ffffffffffffffb0._M_current,
               (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffa8);
    local_48[0]._M_current =
         (Vector *)
         ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::begin
                   ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)
                    in_stack_ffffffffffffff88);
    in_stack_ffffffffffffffb0 =
         ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::end
                   ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)
                    in_stack_ffffffffffffff88);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff90,
                         (__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      in_stack_ffffffffffffffa8 =
           __gnu_cxx::
           __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
           ::operator*(local_48);
      local_38 = local_38 + 1;
      Vector::Reference(in_RCX,in_R8);
      __gnu_cxx::
      __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
      ::operator++(local_48);
    }
    DataChunk::SetCardinality((DataChunk *)in_R8,(idx_t)in_RCX);
  }
  DataChunk::InitializeEmpty
            ((DataChunk *)in_stack_ffffffffffffffb0._M_current,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffa8);
  local_60 = local_30;
  local_68._M_current =
       (Vector *)
       ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::begin
                 ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)
                  in_stack_ffffffffffffff88);
  __lhs = ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::end
                    ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)
                     in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffff88 =
         __gnu_cxx::
         __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
         ::operator*(&local_68);
    local_38 = local_38 + 1;
    Vector::Reference(in_RCX,in_R8);
    __gnu_cxx::
    __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
    ::operator++(&local_68);
  }
  DataChunk::SetCardinality(local_30,(idx_t)in_RCX);
  return;
}

Assistant:

static void ProjectInputs(Vector inputs[], const SortedAggregateBindData &order_bind, idx_t input_count,
	                          idx_t count, DataChunk &arg_input, DataChunk &sort_input) {
		idx_t col = 0;

		if (!order_bind.sorted_on_args) {
			arg_input.InitializeEmpty(order_bind.arg_types);
			for (auto &dst : arg_input.data) {
				dst.Reference(inputs[col++]);
			}
			arg_input.SetCardinality(count);
		}

		sort_input.InitializeEmpty(order_bind.sort_types);
		for (auto &dst : sort_input.data) {
			dst.Reference(inputs[col++]);
		}
		sort_input.SetCardinality(count);
	}